

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O0

GLuint glcts::bitfieldReverse(GLuint input)

{
  undefined4 local_14;
  undefined4 local_10;
  int i;
  GLuint result;
  GLuint input_local;
  
  local_10 = 0;
  i = input;
  for (local_14 = 0; local_14 < 0x20; local_14 = local_14 + 1) {
    local_10 = i & 0x80000000U | local_10 >> 1;
    i = i << 1;
  }
  return local_10;
}

Assistant:

static GLuint bitfieldReverse(GLuint input)
{
	GLuint result = 0;
	for (int i = 0; i < 32; ++i)
	{
		result >>= 1;
		result |= (input & 0x80000000);
		input <<= 1;
	}
	return result;
}